

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O3

char * __thiscall Options::match_longopt(Options *this,char *opt,int len,int *ambiguous)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  char **optv;
  char **ppcVar6;
  int __c;
  int __c_00;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  
  *ambiguous = 0;
  ppcVar6 = this->optvec;
  if ((ppcVar6 == (char **)0x0) || (pcVar8 = *ppcVar6, pcVar8 == (char *)0x0)) {
LAB_001e3f71:
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = (char *)0x0;
    do {
      cVar2 = *pcVar8;
      uVar5 = (ulong)(cVar2 == '-');
      if (((pcVar8[uVar5 + 1] != '\0') && (pcVar8[uVar5 + 2] != '\0')) &&
         (iVar4 = isspace((int)pcVar8[uVar5 + 2]), iVar4 == 0)) {
        pcVar1 = pcVar8 + uVar5 + 2;
        if (pcVar1 == opt) {
LAB_001e3f55:
          return pcVar8 + (uVar5 - (cVar2 == '-'));
        }
        if ((opt != (char *)0x0) && (*opt != '\0')) {
          if (-1 < len) {
            uVar7 = 0;
            do {
              bVar3 = opt[uVar7];
              if ((bVar3 & 0xdf) == 0) break;
              __c = (int)pcVar1[uVar7];
              iVar4 = isupper(__c);
              if (iVar4 != 0) {
                __c = tolower(__c);
              }
              __c_00 = (int)(char)bVar3;
              iVar4 = isupper(__c_00);
              if (iVar4 != 0) {
                __c_00 = tolower(__c_00);
              }
              if (__c != __c_00) goto LAB_001e3e6b;
              uVar7 = uVar7 + 1;
            } while ((int)uVar7 < len || len == 0);
            if (pcVar1[uVar7 & 0xffffffff] == '\0') goto LAB_001e3f55;
          }
          if (pcVar9 != (char *)0x0) {
            *ambiguous = 1;
            goto LAB_001e3f71;
          }
          pcVar9 = pcVar8 + (uVar5 - (cVar2 == '-'));
        }
      }
LAB_001e3e6b:
      pcVar8 = ppcVar6[1];
      ppcVar6 = ppcVar6 + 1;
    } while (pcVar8 != (char *)0x0);
  }
  return pcVar9;
}

Assistant:

const char *
Options::match_longopt(const char * opt, int  len, int & ambiguous) const {
   kwdmatch_t  result;
   const char * matched = NULLSTR ;

   ambiguous = 0;
   if ((optvec == NULL) || (! *optvec))  return  NULLSTR;

   for (const char * const * optv = optvec ; *optv ; optv++) {
      OptionSpec  optspec = *optv;
      const char * longopt = optspec.LongOpt();
      if (longopt == NULL)  continue;
      result = kwdmatch(longopt, opt, len);
      if (result == EXACT_MATCH) {
         return  optspec;
      } else if (result == PARTIAL_MATCH) {
         if (matched) {
            ++ambiguous;
            return  NULLSTR;
         } else {
            matched = optspec;
         }
      }
   }//for

   return  matched;
}